

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O3

int xmlHashGrow(xmlHashTablePtr hash,uint size)

{
  uint uVar1;
  xmlHashEntry *pxVar2;
  size_t __n;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  xmlChar *pxVar6;
  xmlHashEntry *__s;
  xmlHashEntry *pxVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  xmlHashEntry *pxVar11;
  
  __n = (ulong)size * 0x28;
  __s = (xmlHashEntry *)(*xmlMalloc)(__n);
  if (__s == (xmlHashEntry *)0x0) {
    iVar8 = -1;
  }
  else {
    iVar8 = 0;
    memset(__s,0,__n);
    uVar1 = hash->size;
    if ((ulong)uVar1 != 0) {
      pxVar2 = hash->table;
      uVar9 = pxVar2->hashValue;
      pxVar7 = pxVar2;
      while (uVar9 != 0) {
        pxVar7 = pxVar7 + 1;
        if (pxVar2 + uVar1 <= pxVar7) {
          pxVar7 = pxVar2;
        }
        uVar9 = pxVar7->hashValue;
      }
      uVar9 = 0;
      do {
        if (pxVar7->hashValue != 0) {
          uVar10 = pxVar7->hashValue & size - 1;
          pxVar11 = __s + uVar10;
          uVar10 = __s[uVar10].hashValue;
          while (uVar10 != 0) {
            pxVar11 = pxVar11 + 1;
            if (__s + size <= pxVar11) {
              pxVar11 = __s;
            }
            uVar10 = pxVar11->hashValue;
          }
          pxVar11->payload = pxVar7->payload;
          uVar10 = pxVar7->hashValue;
          uVar3 = *(undefined4 *)&pxVar7->field_0x4;
          uVar4 = *(undefined4 *)&pxVar7->key;
          uVar5 = *(undefined4 *)((long)&pxVar7->key + 4);
          pxVar6 = pxVar7->key3;
          pxVar11->key2 = pxVar7->key2;
          pxVar11->key3 = pxVar6;
          pxVar11->hashValue = uVar10;
          *(undefined4 *)&pxVar11->field_0x4 = uVar3;
          *(undefined4 *)&pxVar11->key = uVar4;
          *(undefined4 *)((long)&pxVar11->key + 4) = uVar5;
        }
        pxVar7 = pxVar7 + 1;
        if (pxVar2 + uVar1 <= pxVar7) {
          pxVar7 = hash->table;
        }
        uVar9 = uVar9 + 1;
      } while (uVar9 != uVar1);
      (*xmlFree)(hash->table);
    }
    hash->table = __s;
    hash->size = size;
  }
  return iVar8;
}

Assistant:

static int
xmlHashGrow(xmlHashTablePtr hash, unsigned size) {
    const xmlHashEntry *oldentry, *oldend, *end;
    xmlHashEntry *table;
    unsigned oldsize, i;

    /* Add 0 to avoid spurious -Wtype-limits warning on 64-bit GCC */
    if ((size_t) size + 0 > SIZE_MAX / sizeof(table[0]))
        return(-1);
    table = xmlMalloc(size * sizeof(table[0]));
    if (table == NULL)
        return(-1);
    memset(table, 0, size * sizeof(table[0]));

    oldsize = hash->size;
    if (oldsize == 0)
        goto done;

    oldend = &hash->table[oldsize];
    end = &table[size];

    /*
     * Robin Hood sorting order is maintained if we
     *
     * - compute hash indices with modulo
     * - resize by an integer factor
     * - start to copy from the beginning of a probe sequence
     */
    oldentry = hash->table;
    while (oldentry->hashValue != 0) {
        if (++oldentry >= oldend)
            oldentry = hash->table;
    }

    for (i = 0; i < oldsize; i++) {
        if (oldentry->hashValue != 0) {
            xmlHashEntry *entry = &table[oldentry->hashValue & (size - 1)];

            while (entry->hashValue != 0) {
                if (++entry >= end)
                    entry = table;
            }
            *entry = *oldentry;
        }

        if (++oldentry >= oldend)
            oldentry = hash->table;
    }

    xmlFree(hash->table);

done:
    hash->table = table;
    hash->size = size;

    return(0);
}